

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ScaleLayerParams::InternalSwap
          (ScaleLayerParams *this,ScaleLayerParams *other)

{
  bool bVar1;
  int iVar2;
  WeightParams *pWVar3;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->shapescale_,&other->shapescale_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->shapebias_,&other->shapebias_)
  ;
  pWVar3 = this->scale_;
  this->scale_ = other->scale_;
  other->scale_ = pWVar3;
  pWVar3 = this->bias_;
  this->bias_ = other->bias_;
  other->bias_ = pWVar3;
  bVar1 = this->hasbias_;
  this->hasbias_ = other->hasbias_;
  other->hasbias_ = bVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void ScaleLayerParams::InternalSwap(ScaleLayerParams* other) {
  shapescale_.InternalSwap(&other->shapescale_);
  shapebias_.InternalSwap(&other->shapebias_);
  std::swap(scale_, other->scale_);
  std::swap(bias_, other->bias_);
  std::swap(hasbias_, other->hasbias_);
  std::swap(_cached_size_, other->_cached_size_);
}